

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::update(shared_data *this,bool test_example,bool labeled_example,float loss,float weight
                   ,size_t num_features)

{
  size_t num_features_local;
  float weight_local;
  float loss_local;
  bool labeled_example_local;
  bool test_example_local;
  shared_data *this_local;
  
  this->t = (double)weight + this->t;
  if ((test_example) && (labeled_example)) {
    this->weighted_holdout_examples = (double)weight + this->weighted_holdout_examples;
    this->weighted_holdout_examples_since_last_dump =
         (double)weight + this->weighted_holdout_examples_since_last_dump;
    this->weighted_holdout_examples_since_last_pass =
         (double)weight + this->weighted_holdout_examples_since_last_pass;
    this->holdout_sum_loss = (double)loss + this->holdout_sum_loss;
    this->holdout_sum_loss_since_last_dump = (double)loss + this->holdout_sum_loss_since_last_dump;
    this->holdout_sum_loss_since_last_pass = (double)loss + this->holdout_sum_loss_since_last_pass;
  }
  else {
    if (labeled_example) {
      this->weighted_labeled_examples = (double)weight + this->weighted_labeled_examples;
    }
    else {
      this->weighted_unlabeled_examples = (double)weight + this->weighted_unlabeled_examples;
    }
    this->sum_loss = (double)loss + this->sum_loss;
    this->sum_loss_since_last_dump = (double)loss + this->sum_loss_since_last_dump;
    this->total_features = num_features + this->total_features;
    this->example_number = this->example_number + 1;
  }
  return;
}

Assistant:

void update(bool test_example, bool labeled_example, float loss, float weight, size_t num_features)
  {
    t += weight;
    if (test_example && labeled_example)
    {
      weighted_holdout_examples += weight;  // test weight seen
      weighted_holdout_examples_since_last_dump += weight;
      weighted_holdout_examples_since_last_pass += weight;
      holdout_sum_loss += loss;
      holdout_sum_loss_since_last_dump += loss;
      holdout_sum_loss_since_last_pass += loss;  // since last pass
    }
    else
    {
      if (labeled_example)
        weighted_labeled_examples += weight;
      else
        weighted_unlabeled_examples += weight;
      sum_loss += loss;
      sum_loss_since_last_dump += loss;
      total_features += num_features;
      example_number++;
    }
  }